

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabledForBlock<LargeAllocationBlockAttributes>
          (HeapInfo *this,size_t objectSize)

{
  return (bool)((byte)((this->pageHeapBlockType & PageHeapBlockTypeFilterLarge) >> 5) &
               this->isPageHeapEnabled);
}

Assistant:

bool HeapInfo::IsPageHeapEnabledForBlock(const size_t objectSize)
{
    if (IsPageHeapEnabled())
    {
        if (TBlockAttributes::IsSmallBlock)
        {
            return smallBlockPageHeapBucketFilter.Test(GetBucketIndex(objectSize)) != 0;
        }
        else if (TBlockAttributes::IsMediumBlock)
        {
            return mediumBlockPageHeapBucketFilter.Test(GetMediumBucketIndex(objectSize)) != 0;
        }
        else
        {
            return ((byte)this->pageHeapBlockType & (byte)PageHeapBlockTypeFilter::PageHeapBlockTypeFilterLarge) != 0;
        }
    }
    return false;
}